

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O1

vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
* __thiscall
ylt::metric::static_metric_manager<metrc_tag>::collect
          (vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
           *__return_storage_ptr__,static_metric_manager<metrc_tag> *this)

{
  _Hash_node_base *p_Var1;
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  metrics;
  shared_ptr<ylt::metric::metric_t> local_58;
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (this->metric_map_)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      local_58.super___shared_ptr<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var1[5]._M_nxt;
      local_58.super___shared_ptr<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1[6]._M_nxt;
      if (local_58.super___shared_ptr<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.super___shared_ptr<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.super___shared_ptr<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.super___shared_ptr<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.super___shared_ptr<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<ylt::metric::metric_t>,std::allocator<std::shared_ptr<ylt::metric::metric_t>>>
      ::emplace_back<std::shared_ptr<ylt::metric::metric_t>>
                ((vector<std::shared_ptr<ylt::metric::metric_t>,std::allocator<std::shared_ptr<ylt::metric::metric_t>>>
                  *)&local_48,&local_58);
      if (local_58.super___shared_ptr<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

auto collect() {
    std::vector<std::shared_ptr<metric_t>> metrics;

    for (auto& pair : metric_map_) {
      metrics.push_back(pair.second);
    }

    return metrics;
  }